

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::updateSubtreeHeaders
          (btQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  btBvhSubtreeInfo *pbVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  btBvhSubtreeInfo *pbVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  btQuantizedBvhNode *pbVar15;
  btQuantizedBvhNode *pbVar16;
  int iVar17;
  
  pbVar16 = (this->m_quantizedContiguousNodes).m_data;
  iVar5 = -pbVar16[leftChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar16[leftChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    iVar5 = 1;
  }
  iVar7 = -pbVar16[rightChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar16[rightChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    iVar7 = 1;
  }
  if (iVar5 < 0x81) {
    pbVar15 = pbVar16 + leftChildNodexIndex;
    iVar4 = (this->m_SubtreeHeaders).m_size;
    iVar14 = (this->m_SubtreeHeaders).m_capacity;
    if (iVar4 == iVar14) {
      iVar17 = 1;
      if (iVar4 != 0) {
        iVar17 = iVar4 * 2;
      }
      if (iVar14 < iVar17) {
        if (iVar17 == 0) {
          pbVar11 = (btBvhSubtreeInfo *)0x0;
        }
        else {
          pbVar11 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)iVar17 << 5,0x10);
        }
        lVar12 = (long)(this->m_SubtreeHeaders).m_size;
        if (0 < lVar12) {
          lVar13 = 0;
          do {
            pbVar6 = (this->m_SubtreeHeaders).m_data;
            puVar2 = (undefined8 *)((long)pbVar6->m_quantizedAabbMin + lVar13);
            uVar8 = *puVar2;
            uVar9 = puVar2[1];
            puVar2 = (undefined8 *)((long)pbVar6->m_padding + lVar13 + -4);
            uVar10 = puVar2[1];
            puVar3 = (undefined8 *)((long)pbVar11->m_padding + lVar13 + -4);
            *puVar3 = *puVar2;
            puVar3[1] = uVar10;
            puVar2 = (undefined8 *)((long)pbVar11->m_quantizedAabbMin + lVar13);
            *puVar2 = uVar8;
            puVar2[1] = uVar9;
            lVar13 = lVar13 + 0x20;
          } while (lVar12 * 0x20 != lVar13);
        }
        pbVar6 = (this->m_SubtreeHeaders).m_data;
        if (pbVar6 != (btBvhSubtreeInfo *)0x0) {
          if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar6);
          }
          (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pbVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar17;
      }
    }
    piVar1 = &(this->m_SubtreeHeaders).m_size;
    *piVar1 = *piVar1 + 1;
    pbVar11 = (this->m_SubtreeHeaders).m_data;
    pbVar11[iVar4].m_quantizedAabbMin[0] = pbVar15->m_quantizedAabbMin[0];
    pbVar11[iVar4].m_quantizedAabbMin[1] = pbVar15->m_quantizedAabbMin[1];
    pbVar11[iVar4].m_quantizedAabbMin[2] = pbVar15->m_quantizedAabbMin[2];
    pbVar11[iVar4].m_quantizedAabbMax[0] = pbVar15->m_quantizedAabbMax[0];
    pbVar11[iVar4].m_quantizedAabbMax[1] = pbVar15->m_quantizedAabbMax[1];
    pbVar11[iVar4].m_quantizedAabbMax[2] = pbVar15->m_quantizedAabbMax[2];
    pbVar11[iVar4].m_rootNodeIndex = leftChildNodexIndex;
    pbVar11[iVar4].m_subtreeSize = iVar5;
  }
  if (iVar7 < 0x81) {
    pbVar16 = pbVar16 + rightChildNodexIndex;
    iVar5 = (this->m_SubtreeHeaders).m_size;
    iVar4 = (this->m_SubtreeHeaders).m_capacity;
    if (iVar5 == iVar4) {
      iVar14 = 1;
      if (iVar5 != 0) {
        iVar14 = iVar5 * 2;
      }
      if (iVar4 < iVar14) {
        if (iVar14 == 0) {
          pbVar11 = (btBvhSubtreeInfo *)0x0;
        }
        else {
          pbVar11 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)iVar14 << 5,0x10);
        }
        lVar12 = (long)(this->m_SubtreeHeaders).m_size;
        if (0 < lVar12) {
          lVar13 = 0;
          do {
            pbVar6 = (this->m_SubtreeHeaders).m_data;
            puVar2 = (undefined8 *)((long)pbVar6->m_quantizedAabbMin + lVar13);
            uVar8 = *puVar2;
            uVar9 = puVar2[1];
            puVar2 = (undefined8 *)((long)pbVar6->m_padding + lVar13 + -4);
            uVar10 = puVar2[1];
            puVar3 = (undefined8 *)((long)pbVar11->m_padding + lVar13 + -4);
            *puVar3 = *puVar2;
            puVar3[1] = uVar10;
            puVar2 = (undefined8 *)((long)pbVar11->m_quantizedAabbMin + lVar13);
            *puVar2 = uVar8;
            puVar2[1] = uVar9;
            lVar13 = lVar13 + 0x20;
          } while (lVar12 * 0x20 != lVar13);
        }
        pbVar6 = (this->m_SubtreeHeaders).m_data;
        if (pbVar6 != (btBvhSubtreeInfo *)0x0) {
          if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar6);
          }
          (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pbVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar14;
      }
    }
    piVar1 = &(this->m_SubtreeHeaders).m_size;
    *piVar1 = *piVar1 + 1;
    pbVar11 = (this->m_SubtreeHeaders).m_data;
    pbVar11[iVar5].m_quantizedAabbMin[0] = pbVar16->m_quantizedAabbMin[0];
    pbVar11[iVar5].m_quantizedAabbMin[1] = pbVar16->m_quantizedAabbMin[1];
    pbVar11[iVar5].m_quantizedAabbMin[2] = pbVar16->m_quantizedAabbMin[2];
    pbVar11[iVar5].m_quantizedAabbMax[0] = pbVar16->m_quantizedAabbMax[0];
    pbVar11[iVar5].m_quantizedAabbMax[1] = pbVar16->m_quantizedAabbMax[1];
    pbVar11[iVar5].m_quantizedAabbMax[2] = pbVar16->m_quantizedAabbMax[2];
    pbVar11[iVar5].m_rootNodeIndex = rightChildNodexIndex;
    pbVar11[iVar5].m_subtreeSize = iVar7;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  return;
}

Assistant:

void	btQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex,int rightChildNodexIndex)
{
	btAssert(m_useQuantization);

	btQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes =  leftSubTreeSize * static_cast<int>(sizeof(btQuantizedBvhNode));
	
	btQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes =  rightSubTreeSize *  static_cast<int>(sizeof(btQuantizedBvhNode));

	if(leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if(rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}